

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O3

void perf_get_msurf_descriptor
               (_func_void_integral_image_ptr_interest_point_ptr *function,integral_image *iimage,
               interest_point *ipoint,benchmark_data *data)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  double *pdVar4;
  double *pdVar5;
  benchmark_data *pbVar6;
  long lVar7;
  long lVar8;
  size_t j;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar14 [16];
  vector<double,_std::allocator<double>_> cycleslist;
  long local_80;
  double local_70;
  double *local_68;
  double *pdStack_60;
  double *local_58;
  double local_48;
  benchmark_data *local_40;
  double local_38;
  
  dVar10 = 1.0;
  local_80 = 100;
  local_40 = data;
  do {
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    local_80 = (long)(dVar10 * (double)local_80);
    for (lVar8 = local_80; lVar8 != 0; lVar8 = lVar8 + -1) {
      (*function)(iimage,ipoint);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar9 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (uVar1 & 0xffffffff)
                                ) + (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    local_70 = auVar9._0_8_;
    dVar10 = 100000000.0 / local_70;
  } while (2.0 < dVar10);
  lVar8 = 0;
  local_68 = (double *)0x0;
  pdStack_60 = (double *)0x0;
  local_38 = (double)local_80;
  local_58 = (double *)0x0;
  local_48 = 0.0;
  do {
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    for (lVar7 = local_80; lVar7 != 0; lVar7 = lVar7 + -1) {
      (*function)(iimage,ipoint);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar9 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (uVar1 & 0xffffffff)
                                ) + (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    dVar10 = auVar9._0_8_ / local_38;
    local_70 = dVar10;
    if (pdStack_60 == local_58) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_68,(iterator)pdStack_60,&local_70);
    }
    else {
      *pdStack_60 = dVar10;
      pdStack_60 = pdStack_60 + 1;
    }
    pbVar6 = local_40;
    pdVar5 = pdStack_60;
    pdVar4 = local_68;
    lVar8 = lVar8 + 1;
    local_48 = local_48 + dVar10;
  } while (lVar8 != 10);
  dVar10 = local_48 / 10.0;
  lVar8 = *(long *)(local_40 + 0x210);
  local_70 = dVar10;
  if (local_68 != pdStack_60) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_68,pdStack_60,(int)LZCOUNT((long)pdStack_60 - (long)local_68 >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar4,pdVar5);
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_70;
  auVar12._0_8_ = ((double)lVar8 * 100.0) / dVar10;
  auVar12._8_8_ = 0;
  auVar14._8_8_ = 0x3fdfffffffffffff;
  auVar14._0_8_ = 0x3fdfffffffffffff;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar9 = vpternlogq_avx512vl(auVar14,auVar12,auVar3,0xf8);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar12._0_8_ + auVar9._0_8_;
  auVar3 = vroundsd_avx(auVar13,auVar13,0xb);
  auVar9 = vmovhpd_avx(auVar11,*local_68);
  auVar9 = vcvttpd2uqq_avx512vl(auVar9);
  auVar9 = vpaddq_avx(auVar9,*(undefined1 (*) [16])(pbVar6 + 0x218));
  *(undefined1 (*) [16])(pbVar6 + 0x218) = auVar9;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = pdStack_60[-1];
  lVar8 = vcvttsd2usi_avx512f(auVar9);
  *(long *)(pbVar6 + 0x228) = *(long *)(pbVar6 + 0x228) + lVar8;
  *(double *)(pbVar6 + 0x230) = auVar3._0_8_ / 100.0 + *(double *)(pbVar6 + 0x230);
  operator_delete(local_68,(long)local_58 - (long)local_68);
  return;
}

Assistant:

void perf_get_msurf_descriptor(void (*function)(struct integral_image *, struct interest_point *),
                               struct integral_image *iimage, struct interest_point *ipoint,
                               struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(iimage, ipoint);
        }
        end = stop_tsc(start);

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        start = start_tsc();
        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(iimage, ipoint);
        }
        end = stop_tsc(start);

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles += (uint64_t)cycles;
    data.min_cycles += (uint64_t)cycleslist.front();
    data.max_cycles += (uint64_t)cycleslist.back();
    data.flops_per_cycle += flops_per_cycle;
}